

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON_Utils.c
# Opt level: O0

patch_operation decode_patch_operation(cJSON *patch,cJSON_bool case_sensitive)

{
  int iVar1;
  cJSON *pcVar2;
  cJSON *operation;
  cJSON_bool case_sensitive_local;
  cJSON *patch_local;
  
  pcVar2 = get_object_item(patch,"op",case_sensitive);
  iVar1 = cJSON_IsString(pcVar2);
  if (iVar1 == 0) {
    patch_local._4_4_ = INVALID;
  }
  else {
    iVar1 = strcmp(pcVar2->valuestring,"add");
    if (iVar1 == 0) {
      patch_local._4_4_ = ADD;
    }
    else {
      iVar1 = strcmp(pcVar2->valuestring,"remove");
      if (iVar1 == 0) {
        patch_local._4_4_ = REMOVE;
      }
      else {
        iVar1 = strcmp(pcVar2->valuestring,"replace");
        if (iVar1 == 0) {
          patch_local._4_4_ = REPLACE;
        }
        else {
          iVar1 = strcmp(pcVar2->valuestring,"move");
          if (iVar1 == 0) {
            patch_local._4_4_ = MOVE;
          }
          else {
            iVar1 = strcmp(pcVar2->valuestring,"copy");
            if (iVar1 == 0) {
              patch_local._4_4_ = COPY;
            }
            else {
              iVar1 = strcmp(pcVar2->valuestring,"test");
              if (iVar1 == 0) {
                patch_local._4_4_ = TEST;
              }
              else {
                patch_local._4_4_ = INVALID;
              }
            }
          }
        }
      }
    }
  }
  return patch_local._4_4_;
}

Assistant:

static enum patch_operation decode_patch_operation(const cJSON * const patch, const cJSON_bool case_sensitive)
{
    cJSON *operation = get_object_item(patch, "op", case_sensitive);
    if (!cJSON_IsString(operation))
    {
        return INVALID;
    }

    if (strcmp(operation->valuestring, "add") == 0)
    {
        return ADD;
    }

    if (strcmp(operation->valuestring, "remove") == 0)
    {
        return REMOVE;
    }

    if (strcmp(operation->valuestring, "replace") == 0)
    {
        return REPLACE;
    }

    if (strcmp(operation->valuestring, "move") == 0)
    {
        return MOVE;
    }

    if (strcmp(operation->valuestring, "copy") == 0)
    {
        return COPY;
    }

    if (strcmp(operation->valuestring, "test") == 0)
    {
        return TEST;
    }

    return INVALID;
}